

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

int64_t av1_highbd_pixel_proj_error_avx2
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  __m256i v_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  uint uVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *pvVar10;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar11 [16];
  undefined1 auVar22 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_0000002c;
  int32_t e_2;
  __m256i sum32h_2;
  __m256i sum32l_2;
  __m256i err0h;
  __m256i err0l;
  __m256i diffh;
  __m256i diffl;
  __m256i d0h_1;
  __m256i d0l_1;
  __m256i s0h;
  __m256i s0l;
  __m256i sum32_2;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  __m256i sum32h_1;
  __m256i sum32l_1;
  __m256i err0_1;
  __m256i e0_1;
  __m256i vr_1;
  __m256i vrl_1;
  __m256i vrh_1;
  __m256i vl_1;
  __m256i vh_1;
  __m256i d0l_xq;
  __m256i d0h_xq;
  __m256i fltl_xq;
  __m256i flth_xq;
  __m256i fltl;
  __m256i flth;
  __m256i d0l;
  __m256i d0h;
  __m256i d0_1;
  __m256i s0_1;
  __m256i sum32_1;
  int flt_stride;
  int32_t *flt;
  __m256i xq_inactive;
  __m256i xq_active;
  int32_t xq_on;
  int32_t e;
  int32_t v;
  int32_t u;
  __m256i sum32h;
  __m256i sum32l;
  __m256i err0;
  __m256i e0;
  __m256i vr;
  __m256i vrh;
  __m256i vrl;
  __m256i vh;
  __m256i vl;
  __m256i v1h;
  __m256i v1l;
  __m256i v0h;
  __m256i v0l;
  __m256i flt1h_subu;
  __m256i flt1l_subu;
  __m256i flt0h_subu;
  __m256i flt0l_subu;
  __m256i flt1h;
  __m256i flt1l;
  __m256i flt0h;
  __m256i flt0l;
  __m256i u0h;
  __m256i u0l;
  __m256i u0;
  __m256i d0;
  __m256i s0;
  __m256i sum32;
  __m256i xq1;
  __m256i xq0;
  int64_t err;
  uint16_t *dat;
  uint16_t *src;
  __m256i sum64;
  __m256i rounding;
  int32_t shift;
  int k;
  int j;
  int i;
  undefined1 in_stack_ffffffffffffe7c0 [12];
  int in_stack_ffffffffffffe7cc;
  longlong in_stack_ffffffffffffe7d0;
  uint local_1820;
  void *in_stack_ffffffffffffe7f0;
  long local_1808;
  long local_1800;
  long local_17f8;
  long local_13c8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  long local_fb8;
  long local_fb0;
  long local_fa8;
  undefined1 local_fa0 [32];
  int local_f48;
  int local_f44;
  int local_f40;
  ulong uStack_e98;
  undefined1 local_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  pvVar10 = (void *)0x400;
  auVar1 = vpinsrd_avx(ZEXT416(0x400),0x400,1);
  auVar1 = vpinsrd_avx(auVar1,0x400,2);
  auVar1 = vpinsrd_avx(auVar1,0x400,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x400),0x400,1);
  auVar2 = vpinsrd_avx(auVar2,0x400,2);
  auVar2 = vpinsrd_avx(auVar2,0x400,3);
  uStack_170 = auVar2._0_8_;
  uStack_168 = auVar2._8_8_;
  uStack_e98 = SUB328(ZEXT832(0),4);
  local_fa0 = ZEXT832(uStack_e98) << 0x40;
  local_fa8 = in_RDI << 1;
  local_fb0 = in_R8 << 1;
  local_fb8 = 0;
  if ((*xq < 1) || (xq[1] < 1)) {
    if ((*xq < 1) && (xq[1] < 1)) {
      for (local_f40 = 0; local_f40 < in_EDX; local_f40 = local_f40 + 1) {
        auVar3 = ZEXT1632(ZEXT816(0));
        for (local_f44 = 0; local_f44 <= in_ESI + -0x20; local_f44 = local_f44 + 0x20) {
          auVar14 = auVar3;
          yy_loadu_256((__m256i *)(local_fa8 + (long)local_f44 * 2),pvVar10);
          auVar18 = auVar14;
          yy_loadu_256((__m256i *)(local_fa8 + (long)local_f44 * 2 + 0x20),pvVar10);
          auVar20 = auVar18;
          yy_loadu_256((__m256i *)(local_fb0 + (long)local_f44 * 2),pvVar10);
          auVar21 = auVar20;
          yy_loadu_256((__m256i *)(local_fb0 + (long)local_f44 * 2 + 0x20),pvVar10);
          auVar20 = vpsubw_avx2(auVar20,auVar14);
          auVar21 = vpsubw_avx2(auVar21,auVar18);
          auVar20 = vpmaddwd_avx2(auVar20,auVar20);
          auVar21 = vpmaddwd_avx2(auVar21,auVar21);
          auVar3 = vpaddd_avx2(auVar3,auVar20);
          auVar3 = vpaddd_avx2(auVar3,auVar21);
        }
        auVar20 = vpmovzxdq_avx2(auVar3._0_16_);
        auVar20 = vpaddq_avx2(local_fa0,auVar20);
        auVar3 = vpmovzxdq_avx2(auVar3._16_16_);
        local_fa0 = vpaddq_avx2(auVar20,auVar3);
        for (local_f48 = local_f44; local_f48 < in_ESI; local_f48 = local_f48 + 1) {
          iVar8 = (uint)*(ushort *)(local_fb0 + (long)local_f48 * 2) -
                  (uint)*(ushort *)(local_fa8 + (long)local_f48 * 2);
          local_fb8 = (long)iVar8 * (long)iVar8 + local_fb8;
        }
        local_fb0 = local_fb0 + (long)in_R9D * 2;
        local_fa8 = local_fa8 + (long)in_ECX * 2;
      }
    }
    else {
      if (*xq < 1) {
        local_1820 = *(uint *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4);
      }
      else {
        local_1820 = *(uint *)CONCAT44(in_stack_0000002c,flt1_stride);
      }
      auVar2 = vpinsrd_avx(ZEXT416(local_1820),local_1820,1);
      auVar2 = vpinsrd_avx(auVar2,local_1820,2);
      auVar2 = vpinsrd_avx(auVar2,local_1820,3);
      auVar22 = vpinsrd_avx(ZEXT416(local_1820),local_1820,1);
      auVar22 = vpinsrd_avx(auVar22,local_1820,2);
      auVar22 = vpinsrd_avx(auVar22,local_1820,3);
      uStack_b0 = auVar22._0_8_;
      uStack_a8 = auVar22._8_8_;
      uVar9 = local_1820 * -0x10;
      pvVar10 = (void *)(ulong)uVar9;
      auVar22 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
      auVar22 = vpinsrd_avx(auVar22,uVar9,2);
      auVar22 = vpinsrd_avx(auVar22,uVar9,3);
      auVar11 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
      auVar11 = vpinsrd_avx(auVar11,uVar9,2);
      auVar11 = vpinsrd_avx(auVar11,uVar9,3);
      auVar11 = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar11;
      auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
      in_stack_ffffffffffffe7d0 = _flt0_stride;
      if (0 < *xq) {
        in_stack_ffffffffffffe7d0 = in_stack_00000008;
      }
      if (0 < *xq) {
        flt1._0_4_ = (int)flt0;
      }
      in_stack_ffffffffffffe7cc = (int)flt1;
      local_13c8 = in_stack_ffffffffffffe7d0;
      for (local_f40 = 0; local_f40 < in_EDX; local_f40 = local_f40 + 1) {
        auVar3 = ZEXT1632(ZEXT816(0));
        for (local_f44 = 0; local_f44 <= in_ESI + -0x10; local_f44 = local_f44 + 0x10) {
          auVar16 = auVar3;
          yy_loadu_256((__m256i *)(local_fa8 + (long)local_f44 * 2),pvVar10);
          auVar17 = auVar16;
          yy_loadu_256((__m256i *)(local_fb0 + (long)local_f44 * 2),pvVar10);
          auVar20 = vpmovzxwd_avx2(local_510);
          auVar21 = vpmovzxwd_avx2(auVar17._0_16_);
          auVar18 = auVar21;
          yy_loadu_256((__m256i *)(local_13c8 + 0x20 + (long)local_f44 * 4),pvVar10);
          auVar19 = auVar18;
          yy_loadu_256((__m256i *)(local_13c8 + (long)local_f44 * 4),pvVar10);
          uStack_13a8 = auVar22._8_8_;
          uStack_13b0 = auVar22._0_8_;
          auVar13._16_8_ = uStack_b0;
          auVar13._0_16_ = auVar2;
          auVar13._24_8_ = uStack_a8;
          auVar18 = vpmulld_avx2(auVar18,auVar13);
          auVar14._16_8_ = uStack_b0;
          auVar14._0_16_ = auVar2;
          auVar14._24_8_ = uStack_a8;
          auVar14 = vpmulld_avx2(auVar19,auVar14);
          auVar15._16_8_ = uStack_13b0;
          auVar15._0_16_ = auVar11;
          auVar15._24_8_ = uStack_13a8;
          auVar20 = vpmulld_avx2(auVar20,auVar15);
          auVar19._16_8_ = uStack_13b0;
          auVar19._0_16_ = auVar11;
          auVar19._24_8_ = uStack_13a8;
          auVar21 = vpmulld_avx2(auVar21,auVar19);
          auVar20 = vpaddd_avx2(auVar18,auVar20);
          auVar21 = vpaddd_avx2(auVar14,auVar21);
          auVar18._16_8_ = uStack_170;
          auVar18._0_16_ = auVar1;
          auVar18._24_8_ = uStack_168;
          auVar20 = vpaddd_avx2(auVar20,auVar18);
          auVar18 = vpsrad_avx2(auVar20,ZEXT416(0xb));
          auVar20._16_8_ = uStack_170;
          auVar20._0_16_ = auVar1;
          auVar20._24_8_ = uStack_168;
          auVar20 = vpaddd_avx2(auVar21,auVar20);
          auVar20 = vpsrad_avx2(auVar20,ZEXT416(0xb));
          auVar20 = vpackssdw_avx2(auVar20,auVar18);
          auVar20 = vpermq_avx2(auVar20,0xd8);
          auVar20 = vpaddw_avx2(auVar20,auVar17);
          auVar20 = vpsubw_avx2(auVar20,auVar16);
          auVar20 = vpmaddwd_avx2(auVar20,auVar20);
          auVar3 = vpaddd_avx2(auVar3,auVar20);
        }
        auVar20 = vpmovzxdq_avx2(auVar3._0_16_);
        auVar20 = vpaddq_avx2(local_fa0,auVar20);
        auVar3 = vpmovzxdq_avx2(auVar3._16_16_);
        local_fa0 = vpaddq_avx2(auVar20,auVar3);
        for (local_f48 = local_f44; local_f48 < in_ESI; local_f48 = local_f48 + 1) {
          iVar8 = (((int)(local_1820 *
                          (*(int *)(local_13c8 + (long)local_f48 * 4) +
                          (uint)*(ushort *)(local_fb0 + (long)local_f48 * 2) * -0x10) + 0x400) >>
                   0xb) + (uint)*(ushort *)(local_fb0 + (long)local_f48 * 2)) -
                  (uint)*(ushort *)(local_fa8 + (long)local_f48 * 2);
          local_fb8 = (long)iVar8 * (long)iVar8 + local_fb8;
        }
        local_fb0 = local_fb0 + (long)in_R9D * 2;
        local_fa8 = local_fa8 + (long)in_ECX * 2;
        local_13c8 = local_13c8 + (long)(int)flt1 * 4;
      }
    }
  }
  else {
    uVar9 = *(uint *)CONCAT44(in_stack_0000002c,flt1_stride);
    auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar2 = vpinsrd_avx(auVar2,uVar9,2);
    auVar2 = vpinsrd_avx(auVar2,uVar9,3);
    auVar22 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar22 = vpinsrd_avx(auVar22,uVar9,2);
    auVar22 = vpinsrd_avx(auVar22,uVar9,3);
    uStack_130 = auVar22._0_8_;
    uStack_128 = auVar22._8_8_;
    uVar9 = *(uint *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4);
    pvVar10 = (void *)(ulong)uVar9;
    auVar22 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar22 = vpinsrd_avx(auVar22,uVar9,2);
    auVar22 = vpinsrd_avx(auVar22,uVar9,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar11 = vpinsrd_avx(auVar11,uVar9,2);
    auVar11 = vpinsrd_avx(auVar11,uVar9,3);
    auVar11 = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar11;
    auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
    for (local_f40 = 0; local_f40 < in_EDX; local_f40 = local_f40 + 1) {
      auVar3 = ZEXT1632(ZEXT816(0));
      for (local_f44 = 0; local_f44 <= in_ESI + -0x10; local_f44 = local_f44 + 0x10) {
        auVar12 = auVar3;
        yy_loadu_256((__m256i *)(local_fa8 + (long)local_f44 * 2),pvVar10);
        auVar13 = auVar12;
        yy_loadu_256((__m256i *)(local_fb0 + (long)local_f44 * 2),pvVar10);
        auVar20 = vpsllw_avx2(auVar13,ZEXT416(4));
        auVar20 = vpmovzxwd_avx2(auVar20._0_16_);
        auVar4._8_8_ = uStack_4f8;
        auVar4._0_8_ = local_500;
        auVar21 = vpmovzxwd_avx2(auVar4);
        auVar18 = auVar21;
        yy_loadu_256((__m256i *)(in_stack_00000008 + (long)local_f44 * 4),pvVar10);
        auVar14 = auVar18;
        yy_loadu_256((__m256i *)(in_stack_00000008 + 0x20 + (long)local_f44 * 4),pvVar10);
        auVar19 = auVar14;
        yy_loadu_256((__m256i *)(_flt0_stride + (long)local_f44 * 4),pvVar10);
        auVar15 = auVar19;
        yy_loadu_256((__m256i *)(_flt0_stride + 0x20 + (long)local_f44 * 4),pvVar10);
        uStack_fe8 = auVar22._8_8_;
        uStack_ff0 = auVar22._0_8_;
        auVar18 = vpsubd_avx2(auVar18,auVar20);
        auVar14 = vpsubd_avx2(auVar14,auVar21);
        auVar19 = vpsubd_avx2(auVar19,auVar20);
        auVar15 = vpsubd_avx2(auVar15,auVar21);
        auVar7._16_8_ = uStack_130;
        auVar7._0_16_ = auVar2;
        auVar7._24_8_ = uStack_128;
        auVar20 = vpmulld_avx2(auVar18,auVar7);
        auVar21._16_8_ = uStack_130;
        auVar21._0_16_ = auVar2;
        auVar21._24_8_ = uStack_128;
        auVar21 = vpmulld_avx2(auVar14,auVar21);
        auVar6._16_8_ = uStack_ff0;
        auVar6._0_16_ = auVar11;
        auVar6._24_8_ = uStack_fe8;
        auVar18 = vpmulld_avx2(auVar19,auVar6);
        auVar5._16_8_ = uStack_ff0;
        auVar5._0_16_ = auVar11;
        auVar5._24_8_ = uStack_fe8;
        auVar14 = vpmulld_avx2(auVar15,auVar5);
        auVar20 = vpaddd_avx2(auVar20,auVar18);
        auVar21 = vpaddd_avx2(auVar21,auVar14);
        auVar16._16_8_ = uStack_170;
        auVar16._0_16_ = auVar1;
        auVar16._24_8_ = uStack_168;
        auVar20 = vpaddd_avx2(auVar20,auVar16);
        auVar18 = vpsrad_avx2(auVar20,ZEXT416(0xb));
        auVar17._16_8_ = uStack_170;
        auVar17._0_16_ = auVar1;
        auVar17._24_8_ = uStack_168;
        auVar20 = vpaddd_avx2(auVar21,auVar17);
        auVar20 = vpsrad_avx2(auVar20,ZEXT416(0xb));
        auVar20 = vpackssdw_avx2(auVar18,auVar20);
        auVar20 = vpermq_avx2(auVar20,0xd8);
        auVar20 = vpaddw_avx2(auVar20,auVar13);
        auVar20 = vpsubw_avx2(auVar20,auVar12);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar3 = vpaddd_avx2(auVar3,auVar20);
      }
      auVar20 = vpmovzxdq_avx2(auVar3._0_16_);
      auVar20 = vpaddq_avx2(local_fa0,auVar20);
      auVar3 = vpmovzxdq_avx2(auVar3._16_16_);
      local_fa0 = vpaddq_avx2(auVar20,auVar3);
      for (local_f48 = local_f44; local_f48 < in_ESI; local_f48 = local_f48 + 1) {
        uVar9 = (uint)*(ushort *)(local_fb0 + (long)local_f48 * 2);
        pvVar10 = (void *)(long)local_f48;
        iVar8 = (((int)(*(int *)CONCAT44(in_stack_0000002c,flt1_stride) *
                        (*(int *)(in_stack_00000008 + (long)local_f48 * 4) + uVar9 * -0x10) +
                        *(int *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4) *
                        (*(int *)(_flt0_stride + (long)pvVar10 * 4) + uVar9 * -0x10) + 0x400) >> 0xb
                 ) + (uint)*(ushort *)(local_fb0 + (long)local_f48 * 2)) -
                (uint)*(ushort *)(local_fa8 + (long)local_f48 * 2);
        local_fb8 = (long)iVar8 * (long)iVar8 + local_fb8;
      }
      local_fb0 = local_fb0 + (long)in_R9D * 2;
      local_fa8 = local_fa8 + (long)in_ECX * 2;
      in_stack_00000008 = in_stack_00000008 + (long)(int)flt0 * 4;
      _flt0_stride = _flt0_stride + (long)(int)flt1 * 4;
    }
  }
  v_00._8_12_ = in_stack_ffffffffffffe7c0;
  v_00[0] = 0xaceba3;
  v_00[2]._4_4_ = in_stack_ffffffffffffe7cc;
  v_00[3] = in_stack_ffffffffffffe7d0;
  yy_storeu_256(in_stack_ffffffffffffe7f0,v_00);
  return (long)in_stack_ffffffffffffe7f0 + local_fb8 + local_17f8 + local_1800 + local_1808;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));
  __m256i sum64 = _mm256_setzero_si256();
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {  // Both filters are enabled
    const __m256i xq0 = _mm256_set1_epi32(xq[0]);
    const __m256i xq1 = _mm256_set1_epi32(xq[1]);
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {  // Process 16 pixels at a time
        // Load 16 pixels each from source image and corrupted image
        const __m256i s0 = yy_loadu_256(src + j);
        const __m256i d0 = yy_loadu_256(dat + j);
        // s0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16 (indices)

        // Shift-up each pixel to match filtered image scaling
        const __m256i u0 = _mm256_slli_epi16(d0, SGRPROJ_RST_BITS);

        // Split u0 into two halves and pad each from u16 to i32
        const __m256i u0l = _mm256_cvtepu16_epi32(_mm256_castsi256_si128(u0));
        const __m256i u0h =
            _mm256_cvtepu16_epi32(_mm256_extracti128_si256(u0, 1));
        // u0h, u0l = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as u32

        // Load 16 pixels from each filtered image
        const __m256i flt0l = yy_loadu_256(flt0 + j);
        const __m256i flt0h = yy_loadu_256(flt0 + j + 8);
        const __m256i flt1l = yy_loadu_256(flt1 + j);
        const __m256i flt1h = yy_loadu_256(flt1 + j + 8);
        // flt?l, flt?h = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as u32

        // Subtract shifted corrupt image from each filtered image
        const __m256i flt0l_subu = _mm256_sub_epi32(flt0l, u0l);
        const __m256i flt0h_subu = _mm256_sub_epi32(flt0h, u0h);
        const __m256i flt1l_subu = _mm256_sub_epi32(flt1l, u0l);
        const __m256i flt1h_subu = _mm256_sub_epi32(flt1h, u0h);

        // Multiply basis vectors by appropriate coefficients
        const __m256i v0l = _mm256_mullo_epi32(flt0l_subu, xq0);
        const __m256i v0h = _mm256_mullo_epi32(flt0h_subu, xq0);
        const __m256i v1l = _mm256_mullo_epi32(flt1l_subu, xq1);
        const __m256i v1h = _mm256_mullo_epi32(flt1h_subu, xq1);

        // Add together the contributions from the two basis vectors
        const __m256i vl = _mm256_add_epi32(v0l, v1l);
        const __m256i vh = _mm256_add_epi32(v0h, v1h);

        // Right-shift v with appropriate rounding
        const __m256i vrl =
            _mm256_srai_epi32(_mm256_add_epi32(vl, rounding), shift);
        const __m256i vrh =
            _mm256_srai_epi32(_mm256_add_epi32(vh, rounding), shift);
        // vrh, vrl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0]

        // Saturate each i32 to an i16 then combine both halves
        // The permute (control=[3 1 2 0]) fixes weird ordering from AVX lanes
        const __m256i vr =
            _mm256_permute4x64_epi64(_mm256_packs_epi32(vrl, vrh), 0xd8);
        // intermediate = [15 14 13 12 7 6 5 4] [11 10 9 8 3 2 1 0]
        // vr = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0]

        // Add twin-subspace-sgr-filter to corrupt image then subtract source
        const __m256i e0 = _mm256_sub_epi16(_mm256_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m256i err0 = _mm256_madd_epi16(e0, e0);

        sum32 = _mm256_add_epi32(sum32, err0);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 16)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {  // Only one filter enabled
    const int32_t xq_on = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m256i xq_active = _mm256_set1_epi32(xq_on);
    const __m256i xq_inactive =
        _mm256_set1_epi32(-xq_on * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        // Load 16 pixels from source image
        const __m256i s0 = yy_loadu_256(src + j);
        // s0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16

        // Load 16 pixels from corrupted image and pad each u16 to i32
        const __m256i d0 = yy_loadu_256(dat + j);
        const __m256i d0h =
            _mm256_cvtepu16_epi32(_mm256_extracti128_si256(d0, 1));
        const __m256i d0l = _mm256_cvtepu16_epi32(_mm256_castsi256_si128(d0));
        // d0 = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16
        // d0h, d0l = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        // Load 16 pixels from the filtered image
        const __m256i flth = yy_loadu_256(flt + j + 8);
        const __m256i fltl = yy_loadu_256(flt + j);
        // flth, fltl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        const __m256i flth_xq = _mm256_mullo_epi32(flth, xq_active);
        const __m256i fltl_xq = _mm256_mullo_epi32(fltl, xq_active);
        const __m256i d0h_xq = _mm256_mullo_epi32(d0h, xq_inactive);
        const __m256i d0l_xq = _mm256_mullo_epi32(d0l, xq_inactive);

        const __m256i vh = _mm256_add_epi32(flth_xq, d0h_xq);
        const __m256i vl = _mm256_add_epi32(fltl_xq, d0l_xq);

        // Shift this down with appropriate rounding
        const __m256i vrh =
            _mm256_srai_epi32(_mm256_add_epi32(vh, rounding), shift);
        const __m256i vrl =
            _mm256_srai_epi32(_mm256_add_epi32(vl, rounding), shift);
        // vrh, vrl = [15 14 13 12] [11 10 9 8], [7 6 5 4] [3 2 1 0] as i32

        // Saturate each i32 to an i16 then combine both halves
        // The permute (control=[3 1 2 0]) fixes weird ordering from AVX lanes
        const __m256i vr =
            _mm256_permute4x64_epi64(_mm256_packs_epi32(vrl, vrh), 0xd8);
        // intermediate = [15 14 13 12 7 6 5 4] [11 10 9 8 3 2 1 0] as u16
        // vr = [15 14 13 12 11 10 9 8] [7 6 5 4 3 2 1 0] as u16

        // Subtract twin-subspace-sgr filtered from source image to get error
        const __m256i e0 = _mm256_sub_epi16(_mm256_add_epi16(vr, d0), s0);

        // Calculate squared error and add adjacent values
        const __m256i err0 = _mm256_madd_epi16(e0, e0);

        sum32 = _mm256_add_epi32(sum32, err0);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels in this row (modulo 16)
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_on * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
    }
  } else {  // Neither filter is enabled
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 32; j += 32) {
        // Load 2x16 u16 from source image
        const __m256i s0l = yy_loadu_256(src + j);
        const __m256i s0h = yy_loadu_256(src + j + 16);

        // Load 2x16 u16 from corrupted image
        const __m256i d0l = yy_loadu_256(dat + j);
        const __m256i d0h = yy_loadu_256(dat + j + 16);

        // Subtract corrupted image from source image
        const __m256i diffl = _mm256_sub_epi16(d0l, s0l);
        const __m256i diffh = _mm256_sub_epi16(d0h, s0h);

        // Square error and add adjacent values
        const __m256i err0l = _mm256_madd_epi16(diffl, diffl);
        const __m256i err0h = _mm256_madd_epi16(diffh, diffh);

        sum32 = _mm256_add_epi32(sum32, err0l);
        sum32 = _mm256_add_epi32(sum32, err0h);
      }

      const __m256i sum32l =
          _mm256_cvtepu32_epi64(_mm256_castsi256_si128(sum32));
      sum64 = _mm256_add_epi64(sum64, sum32l);
      const __m256i sum32h =
          _mm256_cvtepu32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum32h);

      // Process remaining pixels (modulu 16)
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  // Sum 4 values from sum64l and sum64h into err
  int64_t sum[4];
  yy_storeu_256(sum, sum64);
  err += sum[0] + sum[1] + sum[2] + sum[3];
  return err;
}